

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

Node * __thiscall Fl_Preferences::Node::search(Node *this,char *path,int offset)

{
  char *pcVar1;
  Node *pNVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  Node *pNVar6;
  Entry *__s;
  
  while( true ) {
    if (offset != 0) {
      __s = (Entry *)this->path_;
      goto LAB_001c1bad;
    }
    if (*path != '.') break;
    pNVar2 = this;
    if (path[1] != '/') {
      if (path[1] == '\0') {
        return this;
      }
      break;
    }
    do {
      this = pNVar2;
      if (((ulong)*(Node ***)&this->field_0x30 & 2) != 0) break;
      pNVar2 = (this->field_2).parent_;
    } while ((this->field_2).parent_ != (Node *)0x0);
    pcVar1 = path + 2;
    path = path + 2;
    offset = 2;
    if (*pcVar1 == '\0') {
      return this;
    }
  }
  __s = (Entry *)this->path_;
  sVar5 = strlen((char *)__s);
  offset = (int)sVar5 + 1;
LAB_001c1bad:
  sVar5 = strlen((char *)__s);
  iVar4 = (int)sVar5;
  if (iVar4 < offset + -1) {
    return (Node *)0x0;
  }
  uVar3 = iVar4 - offset;
  if (uVar3 != 0 && offset <= iVar4) {
    iVar4 = strncmp(path,(char *)((long)&__s->name + (long)offset),(ulong)uVar3);
    if (iVar4 != 0) {
      return (Node *)0x0;
    }
    if (path[uVar3] == '\0') {
      return this;
    }
    if (path[uVar3] != '/') {
      return (Node *)0x0;
    }
  }
  do {
    pNVar2 = this->child_;
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar6 = search(pNVar2,path,offset);
    this = (Node *)&pNVar2->next_;
  } while (pNVar6 == (Node *)0x0);
  return pNVar6;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::search( const char *path, int offset ) { 
  if ( offset == 0 ) {
    if ( path[0] == '.' ) {
      if ( path[1] == 0 ) {
	return this; // user was searching for current node
      } else if ( path[1] == '/' ) {
	Node *nn = this;
	while ( nn->parent() ) nn = nn->parent();
	if ( path[2]==0 ) {		// user is searching for root ( "./" )
	  return nn;
	}
	return nn->search( path+2, 2 ); // do a relative search on the root node
      }
    }
    offset = (int) strlen( path_ ) + 1;
  }
  int len = (int) strlen( path_ );
  if ( len < offset-1 ) return 0;
  len -= offset;
  if ( ( len <= 0 ) || ( strncmp( path, path_+offset, len ) == 0 ) ) {
    if ( len > 0 && path[ len ] == 0 )
      return this;
    if ( len <= 0 || path[ len ] == '/' ) {
      for ( Node *nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->search( path, offset );
	if ( nn ) return nn;
      }
      return 0;
    }
  }
  return 0;
}